

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlUTF8Strloc(xmlChar *utf,xmlChar *utfchar)

{
  byte bVar1;
  byte bVar2;
  int len;
  int iVar3;
  int local_38;
  int ch;
  int size;
  size_t i;
  xmlChar *utfchar_local;
  xmlChar *utf_local;
  
  if ((utf != (xmlChar *)0x0) && (utfchar != (xmlChar *)0x0)) {
    len = xmlUTF8Strsize(utfchar,1);
    _ch = 0;
    utfchar_local = utf;
    while (bVar2 = *utfchar_local, bVar2 != 0) {
      iVar3 = xmlStrncmp(utfchar_local,utfchar,len);
      if (iVar3 == 0) {
        if (_ch < 0x80000000) {
          local_38 = (int)_ch;
        }
        else {
          local_38 = 0;
        }
        return local_38;
      }
      utfchar_local = utfchar_local + 1;
      if ((bVar2 & 0x80) != 0) {
        if ((bVar2 & 0xc0) != 0xc0) {
          return -1;
        }
        while (bVar2 = bVar2 << 1, (bVar2 & 0x80) != 0) {
          bVar1 = *utfchar_local;
          utfchar_local = utfchar_local + 1;
          if ((bVar1 & 0xc0) != 0x80) {
            return -1;
          }
        }
      }
      _ch = _ch + 1;
    }
  }
  return -1;
}

Assistant:

int
xmlUTF8Strloc(const xmlChar *utf, const xmlChar *utfchar) {
    size_t i;
    int size;
    int ch;

    if (utf==NULL || utfchar==NULL) return -1;
    size = xmlUTF8Strsize(utfchar, 1);
        for(i=0; (ch=*utf) != 0; i++) {
            if (xmlStrncmp(utf, utfchar, size)==0)
                return(i > INT_MAX ? 0 : i);
            utf++;
            if ( ch & 0x80 ) {
                /* if not simple ascii, verify proper format */
                if ( (ch & 0xc0) != 0xc0 )
                    return(-1);
                /* then skip over remaining bytes for this char */
                while ( (ch <<= 1) & 0x80 )
                    if ( (*utf++ & 0xc0) != 0x80 )
                        return(-1);
            }
        }

    return(-1);
}